

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
resizeLike<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>const,3,1,false>>
          (PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *this,
          EigenBase<Eigen::Block<const_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3,_1,_false>_> *_other)

{
  Block<const_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3,_1,_false> *other;
  
  PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)this,3,1);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(other.rows(), other.cols());
      const Index othersize = other.rows()*other.cols();
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }